

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FStream.cxx
# Opt level: O2

BOM cmsys::FStream::ReadBOM(istream *in)

{
  undefined8 uVar1;
  BOM BVar2;
  long lVar3;
  uchar bom [4];
  
  if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) != 0) {
    return BOM_None;
  }
  uVar1 = std::istream::tellg();
  std::istream::read((char *)in,(long)bom);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (*(int *)(in + lVar3 + 0x20) == 0) {
    if (bom[1] == 0xbb && bom[0] == 0xef) {
      std::istream::read((char *)in,(long)(bom + 2));
      lVar3 = *(long *)(*(long *)in + -0x18);
      if ((*(int *)(in + lVar3 + 0x20) == 0) && (bom[2] == 0xbf)) {
        return BOM_UTF8;
      }
    }
    else {
      if (bom[1] == 0xff && bom[0] == 0xfe) {
        return BOM_UTF16BE;
      }
      if (bom[0] == '\0' && bom[1] == '\0') {
        std::istream::read((char *)in,(long)(bom + 2));
        lVar3 = *(long *)(*(long *)in + -0x18);
        if (((*(int *)(in + lVar3 + 0x20) == 0) && (bom[2] == 0xfe)) && (bom[3] == 0xff)) {
          return BOM_UTF32BE;
        }
      }
      else if (bom[1] == 0xfe && bom[0] == 0xff) {
        uVar1 = std::istream::tellg();
        std::istream::read((char *)in,(long)(bom + 2));
        BVar2 = BOM_UTF16LE;
        if (((*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) && (bom[2] == '\0')) &&
           (bom[3] == '\0')) {
          return BOM_UTF32LE;
        }
        goto LAB_0031ab85;
      }
    }
  }
  BVar2 = BOM_None;
  std::ios::clear((int)lVar3 + (int)in);
LAB_0031ab85:
  std::istream::seekg(in,uVar1,0);
  return BVar2;
}

Assistant:

BOM ReadBOM(std::istream& in)
{
  if (!in.good()) {
    return BOM_None;
  }
  unsigned long orig = in.tellg();
  unsigned char bom[4];
  in.read(reinterpret_cast<char*>(bom), 2);
  if (!in.good()) {
    in.clear();
    in.seekg(orig);
    return BOM_None;
  }
  if (bom[0] == 0xEF && bom[1] == 0xBB) {
    in.read(reinterpret_cast<char*>(bom + 2), 1);
    if (in.good() && bom[2] == 0xBF) {
      return BOM_UTF8;
    }
  } else if (bom[0] == 0xFE && bom[1] == 0xFF) {
    return BOM_UTF16BE;
  } else if (bom[0] == 0x00 && bom[1] == 0x00) {
    in.read(reinterpret_cast<char*>(bom + 2), 2);
    if (in.good() && bom[2] == 0xFE && bom[3] == 0xFF) {
      return BOM_UTF32BE;
    }
  } else if (bom[0] == 0xFF && bom[1] == 0xFE) {
    unsigned long p = in.tellg();
    in.read(reinterpret_cast<char*>(bom + 2), 2);
    if (in.good() && bom[2] == 0x00 && bom[3] == 0x00) {
      return BOM_UTF32LE;
    }
    in.seekg(p);
    return BOM_UTF16LE;
  }
  in.clear();
  in.seekg(orig);
  return BOM_None;
}